

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O3

int AdvertiseAndReply(int AdFlag,UpnpDevice_Handle Hnd,SsdpSearchType SearchType,sockaddr *DestAddr,
                     char *DeviceType,char *DeviceUDN,char *ServiceType,int Exp)

{
  int Duration;
  int PowerState;
  Upnp_Handle_Type UVar1;
  int iVar2;
  IXML_Element *pIVar3;
  char *pcVar4;
  IXML_NodeList *pIVar5;
  IXML_Node *pIVar6;
  size_t sVar7;
  char *pcVar8;
  int RootDev;
  Upnp_LogLevel DLevel;
  char *FmtStr;
  char *pcVar9;
  int iVar10;
  unsigned_long index;
  unsigned_long index_00;
  int ByType;
  Handle_Info *SInfo;
  sockaddr *local_1c8;
  SsdpSearchType local_1c0;
  int local_1bc;
  IXML_NodeList *local_1b8;
  char *local_1b0;
  char *local_1a8;
  int local_1a0;
  int local_19c;
  char UDNstr [100];
  char cStack_129;
  char devType [100];
  char cStack_b9;
  char servType [100];
  timespec req;
  
  SInfo = (Handle_Info *)0x0;
  UDNstr[0] = '\0';
  UDNstr[1] = '\0';
  UDNstr[2] = '\0';
  UDNstr[3] = '\0';
  UDNstr[4] = '\0';
  UDNstr[5] = '\0';
  UDNstr[6] = '\0';
  UDNstr[7] = '\0';
  UDNstr[8] = '\0';
  UDNstr[9] = '\0';
  UDNstr[10] = '\0';
  UDNstr[0xb] = '\0';
  UDNstr[0xc] = '\0';
  UDNstr[0xd] = '\0';
  UDNstr[0xe] = '\0';
  UDNstr[0xf] = '\0';
  UDNstr[0x10] = '\0';
  UDNstr[0x11] = '\0';
  UDNstr[0x12] = '\0';
  UDNstr[0x13] = '\0';
  UDNstr[0x14] = '\0';
  UDNstr[0x15] = '\0';
  UDNstr[0x16] = '\0';
  UDNstr[0x17] = '\0';
  UDNstr[0x18] = '\0';
  UDNstr[0x19] = '\0';
  UDNstr[0x1a] = '\0';
  UDNstr[0x1b] = '\0';
  UDNstr[0x1c] = '\0';
  UDNstr[0x1d] = '\0';
  UDNstr[0x1e] = '\0';
  UDNstr[0x1f] = '\0';
  UDNstr[0x20] = '\0';
  UDNstr[0x21] = '\0';
  UDNstr[0x22] = '\0';
  UDNstr[0x23] = '\0';
  UDNstr[0x24] = '\0';
  UDNstr[0x25] = '\0';
  UDNstr[0x26] = '\0';
  UDNstr[0x27] = '\0';
  UDNstr[0x28] = '\0';
  UDNstr[0x29] = '\0';
  UDNstr[0x2a] = '\0';
  UDNstr[0x2b] = '\0';
  UDNstr[0x2c] = '\0';
  UDNstr[0x2d] = '\0';
  UDNstr[0x2e] = '\0';
  UDNstr[0x2f] = '\0';
  UDNstr[0x30] = '\0';
  UDNstr[0x31] = '\0';
  UDNstr[0x32] = '\0';
  UDNstr[0x33] = '\0';
  UDNstr[0x34] = '\0';
  UDNstr[0x35] = '\0';
  UDNstr[0x36] = '\0';
  UDNstr[0x37] = '\0';
  UDNstr[0x38] = '\0';
  UDNstr[0x39] = '\0';
  UDNstr[0x3a] = '\0';
  UDNstr[0x3b] = '\0';
  UDNstr[0x3c] = '\0';
  UDNstr[0x3d] = '\0';
  UDNstr[0x3e] = '\0';
  UDNstr[0x3f] = '\0';
  UDNstr[0x40] = '\0';
  UDNstr[0x41] = '\0';
  UDNstr[0x42] = '\0';
  UDNstr[0x43] = '\0';
  UDNstr[0x44] = '\0';
  UDNstr[0x45] = '\0';
  UDNstr[0x46] = '\0';
  UDNstr[0x47] = '\0';
  UDNstr[0x48] = '\0';
  UDNstr[0x49] = '\0';
  UDNstr[0x4a] = '\0';
  UDNstr[0x4b] = '\0';
  UDNstr[0x4c] = '\0';
  UDNstr[0x4d] = '\0';
  UDNstr[0x4e] = '\0';
  UDNstr[0x4f] = '\0';
  UDNstr[0x50] = '\0';
  UDNstr[0x51] = '\0';
  UDNstr[0x52] = '\0';
  UDNstr[0x53] = '\0';
  UDNstr[0x54] = '\0';
  UDNstr[0x55] = '\0';
  UDNstr[0x56] = '\0';
  UDNstr[0x57] = '\0';
  UDNstr[0x58] = '\0';
  UDNstr[0x59] = '\0';
  UDNstr[0x5a] = '\0';
  UDNstr[0x5b] = '\0';
  UDNstr[0x5c] = '\0';
  UDNstr[0x5d] = '\0';
  UDNstr[0x5e] = '\0';
  UDNstr[0x5f] = '\0';
  UDNstr[0x60] = '\0';
  UDNstr[0x61] = '\0';
  UDNstr[0x62] = '\0';
  UDNstr[99] = '\0';
  devType[0] = '\0';
  devType[1] = '\0';
  devType[2] = '\0';
  devType[3] = '\0';
  devType[4] = '\0';
  devType[5] = '\0';
  devType[6] = '\0';
  devType[7] = '\0';
  devType[8] = '\0';
  devType[9] = '\0';
  devType[10] = '\0';
  devType[0xb] = '\0';
  devType[0xc] = '\0';
  devType[0xd] = '\0';
  devType[0xe] = '\0';
  devType[0xf] = '\0';
  devType[0x10] = '\0';
  devType[0x11] = '\0';
  devType[0x12] = '\0';
  devType[0x13] = '\0';
  devType[0x14] = '\0';
  devType[0x15] = '\0';
  devType[0x16] = '\0';
  devType[0x17] = '\0';
  devType[0x18] = '\0';
  devType[0x19] = '\0';
  devType[0x1a] = '\0';
  devType[0x1b] = '\0';
  devType[0x1c] = '\0';
  devType[0x1d] = '\0';
  devType[0x1e] = '\0';
  devType[0x1f] = '\0';
  devType[0x20] = '\0';
  devType[0x21] = '\0';
  devType[0x22] = '\0';
  devType[0x23] = '\0';
  devType[0x24] = '\0';
  devType[0x25] = '\0';
  devType[0x26] = '\0';
  devType[0x27] = '\0';
  devType[0x28] = '\0';
  devType[0x29] = '\0';
  devType[0x2a] = '\0';
  devType[0x2b] = '\0';
  devType[0x2c] = '\0';
  devType[0x2d] = '\0';
  devType[0x2e] = '\0';
  devType[0x2f] = '\0';
  devType[0x30] = '\0';
  devType[0x31] = '\0';
  devType[0x32] = '\0';
  devType[0x33] = '\0';
  devType[0x34] = '\0';
  devType[0x35] = '\0';
  devType[0x36] = '\0';
  devType[0x37] = '\0';
  devType[0x38] = '\0';
  devType[0x39] = '\0';
  devType[0x3a] = '\0';
  devType[0x3b] = '\0';
  devType[0x3c] = '\0';
  devType[0x3d] = '\0';
  devType[0x3e] = '\0';
  devType[0x3f] = '\0';
  devType[0x40] = '\0';
  devType[0x41] = '\0';
  devType[0x42] = '\0';
  devType[0x43] = '\0';
  devType[0x44] = '\0';
  devType[0x45] = '\0';
  devType[0x46] = '\0';
  devType[0x47] = '\0';
  devType[0x48] = '\0';
  devType[0x49] = '\0';
  devType[0x4a] = '\0';
  devType[0x4b] = '\0';
  devType[0x4c] = '\0';
  devType[0x4d] = '\0';
  devType[0x4e] = '\0';
  devType[0x4f] = '\0';
  devType[0x50] = '\0';
  devType[0x51] = '\0';
  devType[0x52] = '\0';
  devType[0x53] = '\0';
  devType[0x54] = '\0';
  devType[0x55] = '\0';
  devType[0x56] = '\0';
  devType[0x57] = '\0';
  devType[0x58] = '\0';
  devType[0x59] = '\0';
  devType[0x5a] = '\0';
  devType[0x5b] = '\0';
  devType[0x5c] = '\0';
  devType[0x5d] = '\0';
  devType[0x5e] = '\0';
  devType[0x5f] = '\0';
  devType[0x60] = '\0';
  devType[0x61] = '\0';
  devType[0x62] = '\0';
  devType[99] = '\0';
  servType[0] = '\0';
  servType[1] = '\0';
  servType[2] = '\0';
  servType[3] = '\0';
  servType[4] = '\0';
  servType[5] = '\0';
  servType[6] = '\0';
  servType[7] = '\0';
  servType[8] = '\0';
  servType[9] = '\0';
  servType[10] = '\0';
  servType[0xb] = '\0';
  servType[0xc] = '\0';
  servType[0xd] = '\0';
  servType[0xe] = '\0';
  servType[0xf] = '\0';
  servType[0x10] = '\0';
  servType[0x11] = '\0';
  servType[0x12] = '\0';
  servType[0x13] = '\0';
  servType[0x14] = '\0';
  servType[0x15] = '\0';
  servType[0x16] = '\0';
  servType[0x17] = '\0';
  servType[0x18] = '\0';
  servType[0x19] = '\0';
  servType[0x1a] = '\0';
  servType[0x1b] = '\0';
  servType[0x1c] = '\0';
  servType[0x1d] = '\0';
  servType[0x1e] = '\0';
  servType[0x1f] = '\0';
  servType[0x20] = '\0';
  servType[0x21] = '\0';
  servType[0x22] = '\0';
  servType[0x23] = '\0';
  servType[0x24] = '\0';
  servType[0x25] = '\0';
  servType[0x26] = '\0';
  servType[0x27] = '\0';
  servType[0x28] = '\0';
  servType[0x29] = '\0';
  servType[0x2a] = '\0';
  servType[0x2b] = '\0';
  servType[0x2c] = '\0';
  servType[0x2d] = '\0';
  servType[0x2e] = '\0';
  servType[0x2f] = '\0';
  servType[0x30] = '\0';
  servType[0x31] = '\0';
  servType[0x32] = '\0';
  servType[0x33] = '\0';
  servType[0x34] = '\0';
  servType[0x35] = '\0';
  servType[0x36] = '\0';
  servType[0x37] = '\0';
  servType[0x38] = '\0';
  servType[0x39] = '\0';
  servType[0x3a] = '\0';
  servType[0x3b] = '\0';
  servType[0x3c] = '\0';
  servType[0x3d] = '\0';
  servType[0x3e] = '\0';
  servType[0x3f] = '\0';
  servType[0x40] = '\0';
  servType[0x41] = '\0';
  servType[0x42] = '\0';
  servType[0x43] = '\0';
  servType[0x44] = '\0';
  servType[0x45] = '\0';
  servType[0x46] = '\0';
  servType[0x47] = '\0';
  servType[0x48] = '\0';
  servType[0x49] = '\0';
  servType[0x4a] = '\0';
  servType[0x4b] = '\0';
  servType[0x4c] = '\0';
  servType[0x4d] = '\0';
  servType[0x4e] = '\0';
  servType[0x4f] = '\0';
  servType[0x50] = '\0';
  servType[0x51] = '\0';
  servType[0x52] = '\0';
  servType[0x53] = '\0';
  servType[0x54] = '\0';
  servType[0x55] = '\0';
  servType[0x56] = '\0';
  servType[0x57] = '\0';
  servType[0x58] = '\0';
  servType[0x59] = '\0';
  servType[0x5a] = '\0';
  servType[0x5b] = '\0';
  servType[0x5c] = '\0';
  servType[0x5d] = '\0';
  servType[0x5e] = '\0';
  servType[0x5f] = '\0';
  servType[0x60] = '\0';
  servType[0x61] = '\0';
  servType[0x62] = '\0';
  servType[99] = '\0';
  local_1c8 = DestAddr;
  local_1c0 = SearchType;
  local_1bc = AdFlag;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x7b,
             "Inside AdvertiseAndReply with AdFlag = %d\n");
  UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x80,"Trying a read lock\n");
  pthread_rwlock_rdlock((pthread_rwlock_t *)&GlobalHndRWLock);
  UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x80,"Read lock acquired\n");
  UVar1 = GetHandleInfo(Hnd,&SInfo);
  if (UVar1 != HND_DEVICE) {
    iVar10 = -100;
    pIVar5 = (IXML_NodeList *)0x0;
LAB_0011e282:
    ixmlNodeList_free((IXML_NodeList *)0x0);
    ixmlNodeList_free(pIVar5);
    UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x217,"Exiting AdvertiseAndReply.\n");
    UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x219,"Trying Unlock\n");
    pthread_rwlock_unlock((pthread_rwlock_t *)&GlobalHndRWLock);
    UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x219,"Unlocked rwlock\n");
    return iVar10;
  }
  Duration = SInfo->MaxAge;
  pIVar5 = (IXML_NodeList *)0x0;
  iVar2 = 0;
  local_1b0 = DeviceType;
  local_1a8 = DeviceUDN;
  do {
    if (iVar2 != 0) {
      iVar10 = 0;
      if ((local_1bc == 0) || (iVar2 != 1)) goto LAB_0011e282;
      req.tv_sec = 0;
      req.tv_nsec = 100000000;
      nanosleep((timespec *)&req,(timespec *)0x0);
    }
    local_19c = iVar2;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x8f,
               "Entering new device list with i = %lu\n\n",0);
    pIVar3 = (IXML_Element *)ixmlNodeList_item(SInfo->DeviceList,0);
    if (pIVar3 != (IXML_Element *)0x0) {
      index = 0;
LAB_0011d824:
      pcVar4 = ixmlNode_getNodeName(&pIVar3->n);
      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0xa1,
                 "Extracting device type once for %s\n",pcVar4);
      ixmlNodeList_free(pIVar5);
      pIVar5 = ixmlElement_getElementsByTagName(pIVar3,"deviceType");
      if (pIVar5 == (IXML_NodeList *)0x0) goto LAB_0011df57;
      UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xac,"Extracting UDN for %s\n",pcVar4);
      UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xb2,"Extracting device type\n");
      pIVar6 = ixmlNodeList_item(pIVar5,0);
      if ((pIVar6 != (IXML_Node *)0x0) &&
         (pIVar6 = ixmlNode_getFirstChild(pIVar6), pIVar6 != (IXML_Node *)0x0)) {
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xbd,"Extracting device type \n");
        pcVar4 = ixmlNode_getNodeValue(pIVar6);
        if (pcVar4 == (char *)0x0) goto LAB_0011df5a;
        strncpy(devType,pcVar4,99);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xc6,"Extracting device type = %s\n",
                   devType);
        pcVar4 = ixmlNode_getNodeName(&pIVar3->n);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xd4,"Extracting UDN for %s\n",pcVar4
                  );
        ixmlNodeList_free(pIVar5);
        pIVar5 = ixmlElement_getElementsByTagName(pIVar3,"UDN");
        if (pIVar5 == (IXML_NodeList *)0x0) {
          DLevel = UPNP_CRITICAL;
          iVar2 = 0xde;
          pcVar4 = "UDN not found!\n";
LAB_0011da86:
          UpnpPrintf(DLevel,API,".upnp/src/ssdp/ssdp_server.c",iVar2,pcVar4);
          goto LAB_0011df57;
        }
        pIVar6 = ixmlNodeList_item(pIVar5,0);
        if (pIVar6 == (IXML_Node *)0x0) {
          iVar2 = 0xe7;
LAB_0011dac3:
          UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",iVar2,"UDN not found!\n");
          goto LAB_0011df5a;
        }
        pIVar6 = ixmlNode_getFirstChild(pIVar6);
        if (pIVar6 == (IXML_Node *)0x0) {
          iVar2 = 0xf0;
          goto LAB_0011dac3;
        }
        pcVar4 = ixmlNode_getNodeValue(pIVar6);
        if (pcVar4 == (char *)0x0) {
          iVar2 = 0xf9;
          goto LAB_0011dac3;
        }
        strncpy(UDNstr,pcVar4,99);
        UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x101,"Sending UDNStr = %s \n",
                   UDNstr);
        pcVar8 = local_1a8;
        pcVar4 = local_1b0;
        if (local_1bc == 0) {
          switch(local_1c0) {
          case SSDP_ALL:
            DeviceReply(local_1c8,devType,(uint)(index == 0),UDNstr,SInfo->DescURL,Duration,
                        SInfo->PowerState,SInfo->SleepPeriod,SInfo->RegistrationState);
            break;
          case SSDP_ROOTDEVICE:
            if (index == 0) {
              PowerState = SInfo->PowerState;
              iVar10 = SInfo->SleepPeriod;
              iVar2 = SInfo->RegistrationState;
              RootDev = 1;
LAB_0011e1fb:
              pcVar9 = SInfo->DescURL;
              pcVar8 = devType;
              ByType = 0;
LAB_0011e20c:
              SendReply(local_1c8,pcVar8,RootDev,UDNstr,pcVar9,Duration,ByType,PowerState,iVar10,
                        iVar2);
            }
            break;
          case SSDP_DEVICEUDN:
            if ((local_1a8 != (char *)0x0) && (*local_1a8 != '\0')) {
              iVar2 = strcasecmp(local_1a8,UDNstr);
              if (iVar2 != 0) {
                iVar2 = 0x13b;
                FmtStr = "DeviceUDN=%s and search UDN=%s DID NOT match\n";
                pcVar9 = UDNstr;
                goto LAB_0011e064;
              }
              UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x13f,
                         "DeviceUDN=%s and search UDN=%s MATCH\n",UDNstr,pcVar8);
              PowerState = SInfo->PowerState;
              iVar10 = SInfo->SleepPeriod;
              iVar2 = SInfo->RegistrationState;
              RootDev = 0;
              goto LAB_0011e1fb;
            }
            break;
          case SSDP_DEVICETYPE:
            sVar7 = strlen(local_1b0);
            iVar2 = strncasecmp(pcVar4,devType,sVar7 - 2);
            if (iVar2 == 0) {
              pcVar8 = strrchr(pcVar4,0x3a);
              iVar2 = atoi(pcVar8 + 1);
              local_1b8 = (IXML_NodeList *)CONCAT44(local_1b8._4_4_,iVar2);
              sVar7 = strlen(devType);
              iVar2 = atoi(devType + (sVar7 - 1));
              pcVar8 = local_1b0;
              if ((int)local_1b8 < iVar2) {
                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x153,
                           "DeviceType=%s and search devType=%s MATCH\n",devType,pcVar4);
                pcVar9 = SInfo->LowerDescURL;
                pcVar8 = pcVar4;
              }
              else {
                if ((int)local_1b8 != iVar2) {
                  iVar2 = 0x166;
                  FmtStr = "DeviceType=%s and search devType=%s DID NOT MATCH\n";
                  pcVar9 = devType;
                  goto LAB_0011e064;
                }
                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x15d,
                           "DeviceType=%s and search devType=%s MATCH\n",devType,local_1b0);
                pcVar9 = SInfo->DescURL;
              }
              PowerState = SInfo->PowerState;
              iVar10 = SInfo->SleepPeriod;
              iVar2 = SInfo->RegistrationState;
              RootDev = 0;
              ByType = 1;
              goto LAB_0011e20c;
            }
            iVar2 = 0x16b;
            FmtStr = "DeviceType=%s and search devType=%s DID NOT MATCH\n";
            pcVar9 = devType;
            pcVar8 = pcVar4;
LAB_0011e064:
            UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",iVar2,FmtStr,pcVar9,pcVar8);
          }
        }
        else if (local_1bc == 1) {
          DeviceAdvertisement(devType,(uint)(index == 0),UDNstr,SInfo->DescURL,Exp,SInfo->DeviceAf,
                              SInfo->PowerState,SInfo->SleepPeriod,SInfo->RegistrationState);
        }
        else {
          DeviceShutdown(devType,(uint)(index == 0),UDNstr,SInfo->DescURL,Exp,SInfo->DeviceAf,
                         SInfo->PowerState,SInfo->SleepPeriod,SInfo->RegistrationState);
        }
        UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x17b,
                   "Sending service Advertisement\n");
        for (pIVar3 = (IXML_Element *)ixmlNode_getFirstChild(&pIVar3->n);
            pIVar3 != (IXML_Element *)0x0;
            pIVar3 = (IXML_Element *)ixmlNode_getNextSibling(&pIVar3->n)) {
          pcVar4 = ixmlNode_getNodeName(&pIVar3->n);
          iVar2 = strncmp(pcVar4,"serviceList",0xc);
          if (iVar2 == 0) {
            ixmlNodeList_free(pIVar5);
            pIVar5 = ixmlElement_getElementsByTagName(pIVar3,"service");
            if (pIVar5 == (IXML_NodeList *)0x0) {
              DLevel = UPNP_INFO;
              iVar2 = 0x196;
              pcVar4 = "Service not found 3\n";
              goto LAB_0011da86;
            }
            local_1b8 = pIVar5;
            pIVar3 = (IXML_Element *)ixmlNodeList_item(pIVar5,0);
            pIVar5 = (IXML_NodeList *)0x0;
            if (pIVar3 == (IXML_Element *)0x0) goto LAB_0011df45;
            index_00 = 1;
            pIVar5 = (IXML_NodeList *)0x0;
            goto LAB_0011dc16;
          }
        }
        goto LAB_0011df52;
      }
      goto LAB_0011df5a;
    }
    index = 0;
LAB_0011e249:
    iVar2 = local_19c + 1;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x97,
               "Exiting new device list with i = %lu\n\n",index);
  } while( true );
LAB_0011dc16:
  do {
    ixmlNodeList_free(pIVar5);
    pIVar5 = ixmlElement_getElementsByTagName(pIVar3,"serviceType");
    if (pIVar5 == (IXML_NodeList *)0x0) {
      UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0x1a6,"ServiceType not found \n");
    }
    else {
      pIVar6 = ixmlNodeList_item(pIVar5,0);
      if (((pIVar6 != (IXML_Node *)0x0) &&
          (pIVar6 = ixmlNode_getFirstChild(pIVar6), pIVar6 != (IXML_Node *)0x0)) &&
         (pcVar4 = ixmlNode_getNodeValue(pIVar6), pcVar4 != (char *)0x0)) {
        strncpy(servType,pcVar4,99);
        UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1b9,"ServiceType = %s\n",servType)
        ;
        if (local_1bc == 0) {
          if (local_1c0 == SSDP_SERVICE) {
            if (ServiceType != (char *)0x0) {
              sVar7 = strlen(ServiceType);
              iVar2 = strncasecmp(ServiceType,servType,sVar7 - 2);
              if (iVar2 == 0) {
                pcVar4 = strrchr(ServiceType,0x3a);
                local_1a0 = atoi(pcVar4 + 1);
                sVar7 = strlen(servType);
                iVar2 = atoi(servType + (sVar7 - 1));
                if (local_1a0 < iVar2) {
                  UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1e6,
                             "ServiceType=%s and search servType=%s MATCH\n",ServiceType,servType);
                  pcVar4 = SInfo->LowerDescURL;
                }
                else {
                  if (local_1a0 != iVar2) {
                    iVar2 = 0x1f9;
                    goto LAB_0011ddf8;
                  }
                  UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1f0,
                             "ServiceType=%s and search servType=%s MATCH\n",ServiceType,servType);
                  pcVar4 = SInfo->DescURL;
                }
                SendReply(local_1c8,ServiceType,0,UDNstr,pcVar4,Duration,1,SInfo->PowerState,
                          SInfo->SleepPeriod,SInfo->RegistrationState);
              }
              else {
                iVar2 = 0x1fe;
LAB_0011ddf8:
                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",iVar2,
                           "ServiceType=%s and search servType=%s DID NOT MATCH\n",ServiceType,
                           servType);
              }
            }
          }
          else if (local_1c0 == SSDP_ALL) {
            ServiceReply(local_1c8,servType,UDNstr,SInfo->DescURL,Duration,SInfo->PowerState,
                         SInfo->SleepPeriod,SInfo->RegistrationState);
          }
        }
        else if (local_1bc == 1) {
          ServiceAdvertisement
                    (UDNstr,servType,SInfo->DescURL,Exp,SInfo->DeviceAf,SInfo->PowerState,
                     SInfo->SleepPeriod,SInfo->RegistrationState);
        }
        else {
          ServiceShutdown(UDNstr,servType,SInfo->DescURL,Exp,SInfo->DeviceAf,SInfo->PowerState,
                          SInfo->SleepPeriod,SInfo->RegistrationState);
        }
      }
    }
    pIVar3 = (IXML_Element *)ixmlNodeList_item(local_1b8,index_00);
    index_00 = index_00 + 1;
  } while (pIVar3 != (IXML_Element *)0x0);
LAB_0011df45:
  ixmlNodeList_free(pIVar5);
  pIVar5 = local_1b8;
LAB_0011df52:
  ixmlNodeList_free(pIVar5);
LAB_0011df57:
  pIVar5 = (IXML_NodeList *)0x0;
LAB_0011df5a:
  index = index + 1;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x8f,
             "Entering new device list with i = %lu\n\n",index);
  pIVar3 = (IXML_Element *)ixmlNodeList_item(SInfo->DeviceList,index);
  if (pIVar3 == (IXML_Element *)0x0) goto LAB_0011e249;
  goto LAB_0011d824;
}

Assistant:

int AdvertiseAndReply(int AdFlag,
	UpnpDevice_Handle Hnd,
	enum SsdpSearchType SearchType,
	struct sockaddr *DestAddr,
	char *DeviceType,
	char *DeviceUDN,
	char *ServiceType,
	int Exp)
{
	int retVal = UPNP_E_SUCCESS;
	long unsigned int i;
	long unsigned int j;
	int defaultExp = DEFAULT_MAXAGE;
	struct Handle_Info *SInfo = NULL;
	char UDNstr[100];
	char devType[100];
	char servType[100];
	IXML_NodeList *nodeList = NULL;
	IXML_NodeList *tmpNodeList = NULL;
	IXML_Node *tmpNode = NULL;
	IXML_Node *tmpNode2 = NULL;
	IXML_Node *textNode = NULL;
	const DOMString tmpStr;
	const DOMString dbgStr;
	int NumCopy = 0;

	memset(UDNstr, 0, sizeof(UDNstr));
	memset(devType, 0, sizeof(devType));
	memset(servType, 0, sizeof(servType));

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside AdvertiseAndReply with AdFlag = %d\n",
		AdFlag);

	/* Use a read lock */
	HandleReadLock(__FILE__, __LINE__);
	if (GetHandleInfo(Hnd, &SInfo) != HND_DEVICE) {
		retVal = UPNP_E_INVALID_HANDLE;
		goto end_function;
	}
	defaultExp = SInfo->MaxAge;
	/* parse the device list and send advertisements/replies */
	while (NumCopy == 0 || (AdFlag && NumCopy < NUM_SSDP_COPY)) {
		if (NumCopy != 0)
			imillisleep(SSDP_PAUSE);
		NumCopy++;
		for (i = 0lu;; i++) {
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Entering new device list with i = %lu\n\n",
				i);
			tmpNode = ixmlNodeList_item(SInfo->DeviceList, i);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"Exiting new device list with i = "
					"%lu\n\n",
					i);
				break;
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type once for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "deviceType");
			if (!nodeList)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type\n");
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2)
				continue;
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type \n");
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr)
				continue;
			strncpy(devType, tmpStr, sizeof(devType) - 1);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type = %s\n",
				devType);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"TempNode is NULL\n");
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "UDN");
			if (!nodeList) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			strncpy(UDNstr, tmpStr, sizeof(UDNstr) - 1);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending UDNStr = %s \n",
				UDNstr);
			if (AdFlag) {
				/* send the device advertisement */
				if (AdFlag == 1) {
					DeviceAdvertisement(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				} else {
					/* AdFlag == -1 */
					DeviceShutdown(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				}
			} else {
				switch (SearchType) {
				case SSDP_ALL:
					DeviceReply(DestAddr,
						devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						defaultExp,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
					break;
				case SSDP_ROOTDEVICE:
					if (i == 0lu) {
						SendReply(DestAddr,
							devType,
							1,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							0,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
					break;
				case SSDP_DEVICEUDN: {
					/* clang-format off */
					if (DeviceUDN && strlen(DeviceUDN) != (size_t)0) {
						if (strcasecmp(DeviceUDN, UDNstr)) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s DID NOT match\n",
								UDNstr, DeviceUDN);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s MATCH\n",
								UDNstr, DeviceUDN);
							SendReply(DestAddr, devType, 0, UDNstr, SInfo->DescURL, defaultExp, 0,
								SInfo->PowerState,
								SInfo->SleepPeriod,
								SInfo->RegistrationState);
						}
					}
					/* clang-format on */
					break;
				}
				case SSDP_DEVICETYPE: {
					/* clang-format off */
					if (!strncasecmp(DeviceType, devType, strlen(DeviceType) - (size_t)2)) {
						if (atoi(strrchr(DeviceType, ':') + 1)
						    < atoi(&devType[strlen(devType) - (size_t)1])) {
							/* the requested version is lower than the device version
							 * must reply with the lower version number and the lower
							 * description URL */
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->LowerDescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else if (atoi(strrchr(DeviceType, ':') + 1)
							   == atoi(&devType[strlen(devType) - (size_t)1])) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->DescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
								   devType, DeviceType);
						}
					} else {
						UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
							   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
							   devType, DeviceType);
					}
					/* clang-format on */
					break;
				}
				default:
					break;
				}
			}
			/* send service advertisements for services
			 * corresponding to the same device */
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending service Advertisement\n");
			/* Correct service traversal such that each device's
			 * serviceList is directly traversed as a child of its
			 * parent device. This ensures that the service's alive
			 * message uses the UDN of the parent device. */
			tmpNode = ixmlNode_getFirstChild(tmpNode);
			while (tmpNode) {
				dbgStr = ixmlNode_getNodeName(tmpNode);
				if (!strncmp(dbgStr,
					    SERVICELIST_STR,
					    sizeof SERVICELIST_STR)) {
					break;
				}
				tmpNode = ixmlNode_getNextSibling(tmpNode);
			}
			ixmlNodeList_free(nodeList);
			if (!tmpNode) {
				nodeList = NULL;
				continue;
			}
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "service");
			if (!nodeList) {
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"Service not found 3\n");
				continue;
			}
			for (j = 0lu;; j++) {
				tmpNode = ixmlNodeList_item(nodeList, j);
				if (!tmpNode) {
					break;
				}
				ixmlNodeList_free(tmpNodeList);
				tmpNodeList = ixmlElement_getElementsByTagName(
					(IXML_Element *)tmpNode, "serviceType");
				if (!tmpNodeList) {
					UpnpPrintf(UPNP_CRITICAL,
						API,
						__FILE__,
						__LINE__,
						"ServiceType not found \n");
					continue;
				}
				tmpNode2 = ixmlNodeList_item(tmpNodeList, 0lu);
				if (!tmpNode2)
					continue;
				textNode = ixmlNode_getFirstChild(tmpNode2);
				if (!textNode)
					continue;
				/* servType is of format
				 * Servicetype:ServiceVersion */
				tmpStr = ixmlNode_getNodeValue(textNode);
				if (!tmpStr)
					continue;
				strncpy(servType, tmpStr, sizeof(servType) - 1);
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"ServiceType = %s\n",
					servType);
				if (AdFlag) {
					if (AdFlag == 1) {
						ServiceAdvertisement(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					} else {
						/* AdFlag == -1 */
						ServiceShutdown(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
				} else {
					switch (SearchType) {
					case SSDP_ALL:
						ServiceReply(DestAddr,
							servType,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
						break;
					case SSDP_SERVICE:
						/* clang-format off */
						if (ServiceType) {
							if (!strncasecmp(ServiceType, servType, strlen(ServiceType) - (size_t)2)) {
								if (atoi(strrchr(ServiceType, ':') + 1) <
								    atoi(&servType[strlen(servType) - (size_t)1])) {
									/* the requested version is lower than the service version
									 * must reply with the lower version number and the lower
									 * description URL */
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->LowerDescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else if (atoi(strrchr (ServiceType, ':') + 1) ==
									   atoi(&servType[strlen(servType) - (size_t)1])) {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->DescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
								}
							} else {
								UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
							}
						}
						/* clang-format on */
						break;
					default:
						break;
					}
				}
			}
			ixmlNodeList_free(tmpNodeList);
			tmpNodeList = NULL;
			ixmlNodeList_free(nodeList);
			nodeList = NULL;
		}
	}

end_function:
	ixmlNodeList_free(tmpNodeList);
	ixmlNodeList_free(nodeList);
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting AdvertiseAndReply.\n");
	HandleUnlock(__FILE__, __LINE__);

	return retVal;
}